

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *eps2,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  bool bVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  int *piVar5;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint local_3ec;
  cpp_dec_float<100U,_int,_void> local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  int *local_368;
  int *local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_310;
  cpp_dec_float<100U,_int,_void> local_308;
  cpp_dec_float<100U,_int,_void> local_2b8;
  cpp_dec_float<100U,_int,_void> local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_88.m_backend.exp = (eps->m_backend).exp;
  local_88.m_backend.neg = (eps->m_backend).neg;
  local_88.m_backend.fpclass = (eps->m_backend).fpclass;
  local_88.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
  local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
  local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
  local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
  local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
  local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
  local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
  local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
  local_d8.m_backend.exp = (eps2->m_backend).exp;
  local_d8.m_backend.neg = (eps2->m_backend).neg;
  local_d8.m_backend.fpclass = (eps2->m_backend).fpclass;
  local_d8.m_backend.prec_elem = (eps2->m_backend).prec_elem;
  vSolveLright2(this,rhs,ridx,rn,&local_88,rhs2,ridx2,rn2,&local_d8);
  local_328 = 0;
  uStack_320 = 0;
  local_338 = 0;
  uStack_330 = 0;
  local_348 = 0;
  uStack_340 = 0;
  local_358 = 0;
  uStack_350 = 0;
  piVar5 = (this->row).perm;
  local_370 = vec;
  local_368 = idx;
  local_310 = this;
  if (forest == (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x0) {
    if (*rn < 1) {
      iVar8 = 0;
    }
    else {
      lVar13 = 0;
      uVar12 = 0;
      do {
        uVar11 = (uint)uVar12;
        iVar8 = ridx[lVar13];
        local_358 = *(undefined8 *)rhs[iVar8].m_backend.data._M_elems;
        uStack_350 = *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar8].m_backend.data._M_elems + 4;
        local_348 = *(undefined8 *)puVar1;
        uStack_340 = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar8].m_backend.data._M_elems + 8;
        local_338 = *(undefined8 *)puVar1;
        uStack_330 = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar8].m_backend.data._M_elems + 0xc;
        local_328 = *(undefined8 *)puVar1;
        uStack_320 = *(undefined8 *)(puVar1 + 2);
        local_3c8.exp = rhs[iVar8].m_backend.exp;
        local_3c8.neg = rhs[iVar8].m_backend.neg;
        local_3c8.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar8].m_backend.data._M_elems;
        local_3c8.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar8].m_backend.data._M_elems + 4;
        local_3c8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_3c8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar8].m_backend.data._M_elems + 8;
        local_3c8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_3c8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar8].m_backend.data._M_elems + 0xc;
        local_3c8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_3c8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_3c8.fpclass = rhs[iVar8].m_backend.fpclass;
        local_3c8.prec_elem = rhs[iVar8].m_backend.prec_elem;
        local_2b8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_2b8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_2b8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_2b8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_2b8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_2b8.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_2b8.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_2b8.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_2b8.exp = (eps->m_backend).exp;
        local_2b8.neg = (eps->m_backend).neg;
        local_2b8.fpclass = (eps->m_backend).fpclass;
        local_2b8.prec_elem = (eps->m_backend).prec_elem;
        if ((local_3c8.neg == true) &&
           (local_3c8.data._M_elems[0] != 0 || local_3c8.fpclass != cpp_dec_float_finite)) {
          local_3c8.neg = false;
        }
        if ((local_2b8.fpclass == cpp_dec_float_NaN || local_3c8.fpclass == cpp_dec_float_NaN) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_3c8,&local_2b8), iVar7 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&rhs[iVar8].m_backend,0);
        }
        else {
          iVar8 = piVar5[iVar8];
          uVar9 = uVar11;
          if (0 < (int)uVar11) {
            do {
              uVar14 = (uint)uVar12 - 1;
              uVar10 = uVar14 >> 1;
              uVar9 = (uint)uVar12;
              if (iVar8 <= ridx[uVar10]) break;
              ridx[uVar12] = ridx[uVar10];
              uVar12 = (ulong)uVar10;
              uVar9 = uVar10;
            } while (1 < uVar14);
          }
          uVar12 = (ulong)(uVar11 + 1);
          ridx[(int)uVar9] = iVar8;
        }
        iVar8 = (int)uVar12;
        lVar13 = lVar13 + 1;
      } while (lVar13 < *rn);
    }
    *rn = iVar8;
  }
  else {
    if (*rn < 1) {
      local_3ec = 0;
    }
    else {
      local_360 = forestIdx;
      lVar13 = 0;
      local_3ec = 0;
      do {
        iVar8 = ridx[lVar13];
        local_358 = *(undefined8 *)rhs[iVar8].m_backend.data._M_elems;
        uStack_350 = *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar8].m_backend.data._M_elems + 4;
        local_348 = *(undefined8 *)puVar1;
        uStack_340 = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar8].m_backend.data._M_elems + 8;
        local_338 = *(undefined8 *)puVar1;
        uStack_330 = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar8].m_backend.data._M_elems + 0xc;
        local_328 = *(undefined8 *)puVar1;
        uStack_320 = *(undefined8 *)(puVar1 + 2);
        iVar7 = rhs[iVar8].m_backend.exp;
        bVar2 = rhs[iVar8].m_backend.neg;
        fVar3 = rhs[iVar8].m_backend.fpclass;
        iVar4 = rhs[iVar8].m_backend.prec_elem;
        local_3c8.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar8].m_backend.data._M_elems;
        local_3c8.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar8].m_backend.data._M_elems + 4;
        local_3c8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_3c8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar8].m_backend.data._M_elems + 8;
        local_3c8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_3c8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar8].m_backend.data._M_elems + 0xc;
        local_3c8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_3c8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_268.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_268.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_268.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_268.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_268.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_268.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_268.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_268.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_268.exp = (eps->m_backend).exp;
        local_268.neg = (eps->m_backend).neg;
        local_268.fpclass = (eps->m_backend).fpclass;
        local_268.prec_elem = (eps->m_backend).prec_elem;
        local_3c8.prec_elem = iVar4;
        local_3c8.fpclass = fVar3;
        local_3c8.neg = bVar2;
        if ((bVar2 == true) && (local_3c8.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
          local_3c8.neg = false;
        }
        local_3c8.exp = iVar7;
        if ((local_268.fpclass == cpp_dec_float_NaN || fVar3 == cpp_dec_float_NaN) ||
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_3c8,&local_268), iVar6 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&rhs[iVar8].m_backend,0);
        }
        else {
          *local_360 = iVar8;
          iVar6 = piVar5[iVar8];
          uVar11 = local_3ec;
          if (0 < (int)local_3ec) {
            do {
              uVar9 = uVar11 - 1;
              uVar10 = uVar9 >> 1;
              if (iVar6 <= ridx[uVar10]) break;
              ridx[uVar11] = ridx[uVar10];
              uVar11 = uVar10;
            } while (1 < uVar9);
          }
          local_360 = local_360 + 1;
          local_3ec = local_3ec + 1;
          ridx[(int)uVar11] = iVar6;
          puVar1 = forest[iVar8].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar1 = local_328;
          *(undefined8 *)(puVar1 + 2) = uStack_320;
          puVar1 = forest[iVar8].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar1 = local_338;
          *(undefined8 *)(puVar1 + 2) = uStack_330;
          puVar1 = forest[iVar8].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = local_348;
          *(undefined8 *)(puVar1 + 2) = uStack_340;
          *(undefined8 *)forest[iVar8].m_backend.data._M_elems = local_358;
          *(undefined8 *)(forest[iVar8].m_backend.data._M_elems + 2) = uStack_350;
          forest[iVar8].m_backend.exp = iVar7;
          forest[iVar8].m_backend.neg = bVar2;
          forest[iVar8].m_backend.fpclass = fVar3;
          forest[iVar8].m_backend.prec_elem = iVar4;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < *rn);
    }
    *rn = local_3ec;
    *forestNum = local_3ec;
  }
  if (*rn2 < 1) {
    iVar8 = 0;
  }
  else {
    lVar13 = 0;
    uVar12 = 0;
    do {
      uVar11 = (uint)uVar12;
      iVar8 = ridx2[lVar13];
      local_358 = *(undefined8 *)rhs2[iVar8].m_backend.data._M_elems;
      uStack_350 = *(undefined8 *)(rhs2[iVar8].m_backend.data._M_elems + 2);
      puVar1 = rhs2[iVar8].m_backend.data._M_elems + 4;
      local_348 = *(undefined8 *)puVar1;
      uStack_340 = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs2[iVar8].m_backend.data._M_elems + 8;
      local_338 = *(undefined8 *)puVar1;
      uStack_330 = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs2[iVar8].m_backend.data._M_elems + 0xc;
      local_328 = *(undefined8 *)puVar1;
      uStack_320 = *(undefined8 *)(puVar1 + 2);
      local_3c8.exp = rhs2[iVar8].m_backend.exp;
      local_3c8.neg = rhs2[iVar8].m_backend.neg;
      local_3c8.data._M_elems._0_8_ = *(undefined8 *)rhs2[iVar8].m_backend.data._M_elems;
      local_3c8.data._M_elems._8_8_ = *(undefined8 *)(rhs2[iVar8].m_backend.data._M_elems + 2);
      puVar1 = rhs2[iVar8].m_backend.data._M_elems + 4;
      local_3c8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_3c8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs2[iVar8].m_backend.data._M_elems + 8;
      local_3c8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_3c8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs2[iVar8].m_backend.data._M_elems + 0xc;
      local_3c8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_3c8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_3c8.fpclass = rhs2[iVar8].m_backend.fpclass;
      local_3c8.prec_elem = rhs2[iVar8].m_backend.prec_elem;
      local_308.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_308.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
      local_308.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_308.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_308.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_308.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
      local_308.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
      local_308.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
      local_308.exp = (eps2->m_backend).exp;
      local_308.neg = (eps2->m_backend).neg;
      local_308.fpclass = (eps2->m_backend).fpclass;
      local_308.prec_elem = (eps2->m_backend).prec_elem;
      if ((local_3c8.neg == true) &&
         (local_3c8.data._M_elems[0] != 0 || local_3c8.fpclass != cpp_dec_float_finite)) {
        local_3c8.neg = false;
      }
      if ((local_308.fpclass == cpp_dec_float_NaN || local_3c8.fpclass == cpp_dec_float_NaN) ||
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_3c8,&local_308), iVar7 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (&rhs2[iVar8].m_backend,0);
      }
      else {
        iVar8 = piVar5[iVar8];
        uVar9 = uVar11;
        if (0 < (int)uVar11) {
          do {
            uVar14 = (uint)uVar12 - 1;
            uVar10 = uVar14 >> 1;
            uVar9 = (uint)uVar12;
            if (iVar8 <= ridx2[uVar10]) break;
            ridx2[uVar12] = ridx2[uVar10];
            uVar12 = (ulong)uVar10;
            uVar9 = uVar10;
          } while (1 < uVar14);
        }
        uVar12 = (ulong)(uVar11 + 1);
        ridx2[(int)uVar9] = iVar8;
      }
      iVar8 = (int)uVar12;
      lVar13 = lVar13 + 1;
    } while (lVar13 < *rn2);
  }
  this_00 = local_310;
  *rn2 = iVar8;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_128.m_backend.exp = (eps->m_backend).exp;
  local_128.m_backend.neg = (eps->m_backend).neg;
  local_128.m_backend.fpclass = (eps->m_backend).fpclass;
  local_128.m_backend.prec_elem = (eps->m_backend).prec_elem;
  iVar8 = vSolveUright(local_310,local_370,local_368,rhs,ridx,*rn,&local_128);
  *rn = iVar8;
  local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
  local_178.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
  local_178.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
  local_178.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
  local_178.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
  local_178.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
  local_178.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
  local_178.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
  local_178.m_backend.exp = (eps2->m_backend).exp;
  local_178.m_backend.neg = (eps2->m_backend).neg;
  local_178.m_backend.fpclass = (eps2->m_backend).fpclass;
  local_178.m_backend.prec_elem = (eps2->m_backend).prec_elem;
  iVar8 = vSolveUright(this_00,vec2,idx2,rhs2,ridx2,*rn2,&local_178);
  *rn2 = iVar8;
  if ((this_00->l).updateType == 0) {
    local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_1c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_1c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_1c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_1c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_1c8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
    local_1c8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc)
    ;
    local_1c8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe)
    ;
    local_1c8.m_backend.exp = (eps->m_backend).exp;
    local_1c8.m_backend.neg = (eps->m_backend).neg;
    local_1c8.m_backend.fpclass = (eps->m_backend).fpclass;
    local_1c8.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar8 = vSolveUpdateRight(this_00,local_370,local_368,*rn,&local_1c8);
    *rn = iVar8;
    local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
    local_218.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
    local_218.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
    local_218.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
    local_218.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
    local_218.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10)
    ;
    local_218.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
    local_218.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
    local_218.m_backend.exp = (eps2->m_backend).exp;
    local_218.m_backend.neg = (eps2->m_backend).neg;
    local_218.m_backend.fpclass = (eps2->m_backend).fpclass;
    local_218.m_backend.prec_elem = (eps2->m_backend).prec_elem;
    iVar8 = vSolveUpdateRight(this_00,vec2,idx2,*rn2,&local_218);
    *rn2 = iVar8;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update2sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R* forest, int* forestNum, int* forestIdx)
{
   /* solve with L */
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap for both ridx and ridx2 */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   /* solve with U */
   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
   }
}